

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

int resolve_absolute_schema_nodeid(char *nodeid,lys_module *module,int ret_nodetype,lys_node **ret)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  lys_node *plVar4;
  lys_node *parent;
  int iVar5;
  lys_node *sibling;
  char *local_70;
  char *name;
  lys_node **local_60;
  char *local_58;
  char *local_50;
  char *mod_name;
  int local_3c;
  int local_38;
  int nam_len;
  int mod_name_len;
  int is_relative;
  
  nam_len = -1;
  if (((nodeid == (char *)0x0) || (module == (lys_module *)0x0)) || (ret == (lys_node **)0x0)) {
    __assert_fail("nodeid && module && ret",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x8c3,
                  "int resolve_absolute_schema_nodeid(const char *, const struct lys_module *, int, const struct lys_node **)"
                 );
  }
  if (((ret_nodetype & 0x3000U) != 0) ||
     (((uint)ret_nodetype >> 0xb & 1) != 0 && ret_nodetype != 0x800)) {
    __assert_fail("!(ret_nodetype & (LYS_USES | LYS_AUGMENT)) && ((ret_nodetype == LYS_GROUPING) || !(ret_nodetype & LYS_GROUPING))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x8c4,
                  "int resolve_absolute_schema_nodeid(const char *, const struct lys_module *, int, const struct lys_node **)"
                 );
  }
  uVar2 = parse_schema_nodeid(nodeid,&local_50,&local_38,&local_70,&local_3c,&nam_len,(int *)0x0,
                              (int *)0x0,0);
  if ((int)uVar2 < 1) {
    iVar5 = 1 - uVar2;
  }
  else {
    iVar5 = -1;
    if ((nam_len == 0) &&
       (local_60 = ret, name = (char *)lyp_get_module(module,(char *)0x0,0,local_50,local_38,0),
       (lys_module *)name != (lys_module *)0x0)) {
      iVar5 = 0;
      local_58 = nodeid;
      plVar4 = lys_getnext((lys_node *)0x0,(lys_node *)0x0,(lys_module *)name,0x10f);
      if (plVar4 != (lys_node *)0x0) {
        mod_name = local_58 + uVar2;
        parent = (lys_node *)0x0;
LAB_00113c5d:
        do {
          sibling = plVar4;
          iVar3 = schema_nodeid_siblingcheck(sibling,module,local_50,local_38,local_70,local_3c);
          pcVar1 = mod_name;
          if (iVar3 != 1) {
            if (iVar3 != 0) {
              return -1;
            }
            if (*mod_name != '\0') {
              uVar2 = parse_schema_nodeid(mod_name,&local_50,&local_38,&local_70,&local_3c,&nam_len,
                                          (int *)0x0,(int *)0x0,0);
              if ((int)uVar2 < 1) {
                return ((int)pcVar1 - ((int)local_58 + uVar2)) + 1;
              }
              mod_name = pcVar1 + uVar2;
              plVar4 = lys_getnext((lys_node *)0x0,sibling,(lys_module *)name,0x10f);
              parent = sibling;
              if (plVar4 == (lys_node *)0x0) break;
              goto LAB_00113c5d;
            }
            if ((sibling->nodetype & ret_nodetype) != LYS_UNKNOWN) {
              *local_60 = sibling;
              return 0;
            }
          }
          plVar4 = lys_getnext(sibling,parent,(lys_module *)name,0x10f);
        } while (plVar4 != (lys_node *)0x0);
      }
      *local_60 = (lys_node *)0x0;
    }
  }
  return iVar5;
}

Assistant:

int
resolve_absolute_schema_nodeid(const char *nodeid, const struct lys_module *module, int ret_nodetype,
                               const struct lys_node **ret)
{
    const char *name, *mod_name, *id;
    const struct lys_node *sibling, *start_parent;
    int r, nam_len, mod_name_len, is_relative = -1;
    const struct lys_module *abs_start_mod;

    assert(nodeid && module && ret);
    assert(!(ret_nodetype & (LYS_USES | LYS_AUGMENT)) && ((ret_nodetype == LYS_GROUPING) || !(ret_nodetype & LYS_GROUPING)));

    id = nodeid;
    start_parent = NULL;

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL, NULL, 0)) < 1) {
        return ((id - nodeid) - r) + 1;
    }
    id += r;

    if (is_relative) {
        return -1;
    }

    abs_start_mod = lyp_get_module(module, NULL, 0, mod_name, mod_name_len, 0);
    if (!abs_start_mod) {
        return -1;
    }

    while (1) {
        sibling = NULL;
        while ((sibling = lys_getnext(sibling, start_parent, abs_start_mod, LYS_GETNEXT_WITHCHOICE
                | LYS_GETNEXT_WITHCASE | LYS_GETNEXT_WITHINOUT | LYS_GETNEXT_WITHGROUPING | LYS_GETNEXT_NOSTATECHECK))) {
            r = schema_nodeid_siblingcheck(sibling, module, mod_name, mod_name_len, name, nam_len);
            if (r == 0) {
                if (!id[0]) {
                    if (!(sibling->nodetype & ret_nodetype)) {
                        /* wrong node type, too bad */
                        continue;
                    }
                    *ret = sibling;
                    return EXIT_SUCCESS;
                }
                start_parent = sibling;
                break;
            } else if (r == 1) {
                continue;
            } else {
                return -1;
            }
        }

        /* no match */
        if (!sibling) {
            *ret = NULL;
            return EXIT_SUCCESS;
        }

        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL, NULL, 0)) < 1) {
            return ((id - nodeid) - r) + 1;
        }
        id += r;
    }

    /* cannot get here */
    LOGINT(module->ctx);
    return -1;
}